

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O3

void __thiscall RK_Individual::calculaFuncaoObjetivoOtimizado(RK_Individual *this,Graph *g)

{
  pointer ppCVar1;
  int iVar2;
  int iVar3;
  Chromosome *pCVar4;
  Vertex *pVVar5;
  Vertex *pVVar6;
  long lVar7;
  ulong uVar8;
  pointer ppCVar9;
  pointer ppCVar10;
  pointer ppCVar11;
  Vertex *pVVar12;
  Edge *pEVar13;
  pointer ppCVar14;
  double *pdVar15;
  Chromosome *pCVar16;
  pointer ppCVar17;
  value_type __val_2;
  pointer ppCVar18;
  int iVar19;
  size_t sVar20;
  ulong uVar21;
  value_type __val;
  int iVar22;
  value_type __val_6;
  long lVar23;
  __normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_> __i;
  double dVar24;
  
  ppCVar17 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppCVar14 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    lVar23 = (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
    uVar8 = lVar23 >> 3;
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
              ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                )cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl
                 .super__Vector_impl_data._M_finish,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x1054ca);
    ppCVar11 = ppCVar14 + 1;
    ppCVar18 = ppCVar14;
    if (lVar23 < 0x81) {
      while (ppCVar10 = ppCVar11, ppCVar10 != ppCVar17) {
        pCVar4 = *ppCVar10;
        iVar19 = pCVar4->position;
        if (iVar19 < (*ppCVar14)->position) {
          memmove((void *)((long)ppCVar18 + (0x10 - ((long)ppCVar10 - (long)ppCVar14))),ppCVar14,
                  (long)ppCVar10 - (long)ppCVar14);
          ppCVar11 = ppCVar14;
        }
        else {
          pCVar16 = *ppCVar18;
          iVar22 = pCVar16->position;
          ppCVar11 = ppCVar10;
          while (iVar19 < iVar22) {
            *ppCVar11 = pCVar16;
            pCVar16 = ppCVar11[-2];
            ppCVar11 = ppCVar11 + -1;
            iVar22 = pCVar16->position;
          }
        }
        *ppCVar11 = pCVar4;
        ppCVar18 = ppCVar10;
        ppCVar11 = ppCVar10 + 1;
      }
    }
    else {
      sVar20 = 8;
      ppCVar18 = ppCVar11;
      ppCVar10 = ppCVar14;
      do {
        ppCVar1 = (pointer)((long)ppCVar14 + sVar20);
        pCVar4 = *(Chromosome **)((long)ppCVar14 + sVar20);
        iVar19 = pCVar4->position;
        if (iVar19 < (*ppCVar14)->position) {
          memmove(ppCVar11,ppCVar14,sVar20);
          ppCVar10 = ppCVar14;
        }
        else {
          pCVar16 = *ppCVar10;
          iVar22 = pCVar16->position;
          ppCVar10 = ppCVar1;
          ppCVar9 = ppCVar18;
          while (iVar19 < iVar22) {
            *ppCVar9 = pCVar16;
            pCVar16 = ppCVar9[-2];
            ppCVar10 = ppCVar9 + -1;
            ppCVar9 = ppCVar10;
            iVar22 = pCVar16->position;
          }
        }
        *ppCVar10 = pCVar4;
        sVar20 = sVar20 + 8;
        ppCVar18 = ppCVar18 + 1;
        ppCVar10 = ppCVar1;
      } while (sVar20 != 0x80);
      for (ppCVar14 = ppCVar14 + 0x10; ppCVar14 != ppCVar17; ppCVar14 = ppCVar14 + 1) {
        pCVar4 = ppCVar14[-1];
        pCVar16 = *ppCVar14;
        iVar22 = pCVar16->position;
        iVar19 = pCVar4->position;
        ppCVar11 = ppCVar14;
        while (iVar22 < iVar19) {
          *ppCVar11 = pCVar4;
          pCVar4 = ppCVar11[-2];
          ppCVar11 = ppCVar11 + -1;
          iVar19 = pCVar4->position;
        }
        *ppCVar11 = pCVar16;
      }
    }
  }
  ppCVar17 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppCVar14 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  iVar19 = this->number_of_edges;
  if (0 < (long)iVar19) {
    uVar8 = (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    pdVar15 = this->weights;
    uVar21 = 0;
    do {
      if (uVar8 == uVar21) goto LAB_00105f9c;
      ppCVar14[uVar21]->weight = pdVar15[uVar21];
      uVar21 = uVar21 + 1;
    } while ((long)iVar19 != uVar21);
  }
  if (ppCVar14 != ppCVar17) {
    uVar8 = (long)ppCVar17 - (long)ppCVar14 >> 3;
    lVar7 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
              ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                )ppCVar14,
               (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
                )ppCVar17,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x1054bc);
    ppCVar11 = ppCVar14 + 1;
    ppCVar18 = ppCVar14;
    if ((long)ppCVar17 - (long)ppCVar14 < 0x81) {
      while (ppCVar10 = ppCVar11, ppCVar10 != ppCVar17) {
        pCVar4 = *ppCVar10;
        dVar24 = pCVar4->weight;
        if (dVar24 < (*ppCVar14)->weight || dVar24 == (*ppCVar14)->weight) {
          pCVar16 = *ppCVar18;
          ppCVar11 = ppCVar10;
          if (pCVar16->weight <= dVar24 && dVar24 != pCVar16->weight) {
            do {
              *ppCVar11 = pCVar16;
              pCVar16 = ppCVar11[-2];
              ppCVar11 = ppCVar11 + -1;
            } while (pCVar16->weight <= dVar24 && dVar24 != pCVar16->weight);
          }
        }
        else {
          memmove((void *)((long)ppCVar18 + (0x10 - ((long)ppCVar10 - (long)ppCVar14))),ppCVar14,
                  (long)ppCVar10 - (long)ppCVar14);
          ppCVar11 = ppCVar14;
        }
        *ppCVar11 = pCVar4;
        ppCVar18 = ppCVar10;
        ppCVar11 = ppCVar10 + 1;
      }
    }
    else {
      sVar20 = 8;
      ppCVar18 = ppCVar11;
      ppCVar10 = ppCVar14;
      do {
        ppCVar1 = (pointer)((long)ppCVar14 + sVar20);
        pCVar4 = *(Chromosome **)((long)ppCVar14 + sVar20);
        dVar24 = pCVar4->weight;
        if (dVar24 < (*ppCVar14)->weight || dVar24 == (*ppCVar14)->weight) {
          pCVar16 = *ppCVar10;
          ppCVar10 = ppCVar1;
          ppCVar9 = ppCVar18;
          if (pCVar16->weight <= dVar24 && dVar24 != pCVar16->weight) {
            do {
              *ppCVar9 = pCVar16;
              pCVar16 = ppCVar9[-2];
              ppCVar10 = ppCVar9 + -1;
              ppCVar9 = ppCVar10;
            } while (pCVar16->weight <= dVar24 && dVar24 != pCVar16->weight);
          }
        }
        else {
          memmove(ppCVar11,ppCVar14,sVar20);
          ppCVar10 = ppCVar14;
        }
        *ppCVar10 = pCVar4;
        sVar20 = sVar20 + 8;
        ppCVar18 = ppCVar18 + 1;
        ppCVar10 = ppCVar1;
      } while (sVar20 != 0x80);
      for (ppCVar14 = ppCVar14 + 0x10; ppCVar14 != ppCVar17; ppCVar14 = ppCVar14 + 1) {
        pCVar16 = ppCVar14[-1];
        pCVar4 = *ppCVar14;
        dVar24 = pCVar4->weight;
        ppCVar11 = ppCVar14;
        if (pCVar16->weight <= dVar24 && dVar24 != pCVar16->weight) {
          do {
            *ppCVar11 = pCVar16;
            pCVar16 = ppCVar11[-2];
            ppCVar11 = ppCVar11 + -1;
          } while (pCVar16->weight <= dVar24 && dVar24 != pCVar16->weight);
        }
        *ppCVar11 = pCVar4;
      }
    }
  }
  iVar19 = ~g->numberOfNonModifiable + g->verticesSize;
  if (0 < iVar19) {
    uVar8 = 0;
    iVar22 = 0;
    ppCVar14 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
    ppCVar17 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      if ((ulong)((long)ppCVar14 - (long)ppCVar17 >> 3) <= uVar8) {
LAB_00105f9c:
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar8
                  );
      }
      pEVar13 = ppCVar17[uVar8]->edge;
      pVVar5 = pEVar13->origin;
      pVVar6 = pEVar13->destiny;
      iVar2 = pVVar5->idTree;
      iVar3 = pVVar6->idTree;
      if ((iVar2 != iVar3) && (pEVar13->closed == false)) {
        for (pVVar12 = g->verticesList; pVVar12 != (Vertex *)0x0; pVVar12 = pVVar12->nextVertex) {
          if (pVVar12->idTree == iVar2) {
            pVVar12->idTree = iVar3;
          }
        }
        pEVar13->closed = true;
        pEVar13 = Graph::findEdge(g,pVVar6->id,pVVar5->id);
        pEVar13->closed = true;
        iVar22 = iVar22 + 1;
        ppCVar14 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        ppCVar17 = cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      }
      uVar8 = uVar8 + 1;
    } while (iVar22 < iVar19);
  }
  Graph::defineFlows(g);
  Graph::evaluateLossesAndFlows(g,1e-08,0);
  pdVar15 = Graph::getLossesReseting(g);
  this->active_loss = *pdVar15;
  dVar24 = pdVar15[1];
  this->reactive_loss = dVar24;
  if (NAN(*pdVar15)) {
    this->active_loss = 9999999999.0;
    dVar24 = pdVar15[1];
  }
  if (NAN(dVar24)) {
    this->reactive_loss = 9999999999.0;
  }
  operator_delete(pdVar15,8);
  return;
}

Assistant:

void RK_Individual::calculaFuncaoObjetivoOtimizado(Graph *g){

    /** colocar os cromossomos na ordem correta em que aparecem no grafo antes de associar os pesos **/
    sort(cromossomos.begin(), cromossomos.end(), ordenaPosicaoCromossomo);

    /** copia peso do individio paca cada cromossomo **/
    for(int i=0; i<this->getNumEdges(); i++)
        cromossomos.at(i)->weight = this->weights[i];

    sort(cromossomos.begin(), cromossomos.end(), sortChromosome);

    int n_arc_inseridos = 0, n_arcos_inserir = g->getVerticesSize() - 1 - g->getNumberOfNonModifiable();


    /** percorre vetor de cromossomos ordenados e tenta fechar chave(algoritmo de kruskal) **/
    for(int i=0; n_arc_inseridos<n_arcos_inserir; i++){

        if((cromossomos.at(i)->edge->getOrigin()->getIdTree() != cromossomos.at(i)->edge->getDestiny()->getIdTree()) &&
                cromossomos.at(i)->edge->isClosed() == false){

            int id = cromossomos.at(i)->edge->getOrigin()->getIdTree();
            for(Vertex *no = g->get_verticesList(); no != NULL; no = no->getNext()){
                if(no->getIdTree() == id)
                    no->setIdTree(cromossomos.at(i)->edge->getDestiny()->getIdTree());
            }

            cromossomos.at(i)->edge->setSwitch(true);
            g->findEdge(cromossomos.at(i)->edge->getDestiny()->getID(),
                        cromossomos.at(i)->edge->getOrigin()->getID())->setSwitch(true);

            n_arc_inseridos++;
        }

    }


    g->defineFlows();
    g->evaluateLossesAndFlows(1e-8); /** calcula fluxos e perda com erro de 1e-5 **/

    double *perdas = g->getLossesReseting();/** soma as perdas ativas e reativas em todos os arcos e retorna um double* **/

    this->active_loss = perdas[0];
    this->reactive_loss = perdas[1];

    /** no caso de solucoes que possuem configuracao viavel porem sao muito longas **/
    if(isnan(perdas[0]))
        this->active_loss = 9999999999;

    if(isnan(perdas[1]))
        this->reactive_loss = 9999999999;

    delete perdas;
}